

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *output_directory,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list)

{
  long lVar1;
  Params *pPVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  FileDescriptor *pFVar6;
  undefined4 extraout_var_00;
  long lVar7;
  long local_150;
  string filename;
  EnumGenerator local_f8;
  Printer printer;
  ZeroCopyOutputStream *pZVar5;
  
  bVar3 = Params::java_multiple_files(this->params_,*(string **)this->file_);
  if (bVar3) {
    local_150 = 0;
    for (lVar7 = 0; pFVar6 = this->file_, lVar7 < *(int *)(pFVar6 + 0x58); lVar7 = lVar7 + 1) {
      lVar1 = *(long *)(pFVar6 + 0x60);
      pPVar2 = this->params_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     package_dir,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar1 + local_150));
      std::operator+(&filename,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     ".java");
      std::__cxx11::string::~string((string *)&printer);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(file_list,&filename);
      iVar4 = (*output_directory->_vptr_GeneratorContext[2])(output_directory,&filename);
      pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
      io::Printer::Printer(&printer,pZVar5,'$');
      io::Printer::Print(&printer,"// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
      if ((this->java_package_)._M_string_length != 0) {
        io::Printer::Print(&printer,"\npackage $package$;\n","package",&this->java_package_);
      }
      MessageGenerator::MessageGenerator
                ((MessageGenerator *)&local_f8,(Descriptor *)(lVar1 + local_150),pPVar2);
      MessageGenerator::Generate((MessageGenerator *)&local_f8,&printer);
      MessageGenerator::~MessageGenerator((MessageGenerator *)&local_f8);
      io::Printer::~Printer(&printer);
      if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
      }
      std::__cxx11::string::~string((string *)&filename);
      local_150 = local_150 + 0xa8;
    }
    if (this->params_->java_enum_style_ == true) {
      local_150 = 0;
      for (lVar7 = 0; lVar7 < *(int *)(pFVar6 + 0x68); lVar7 = lVar7 + 1) {
        lVar1 = *(long *)(pFVar6 + 0x70);
        pPVar2 = this->params_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,package_dir,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + local_150));
        std::operator+(&filename,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,".java");
        std::__cxx11::string::~string((string *)&printer);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(file_list,&filename);
        iVar4 = (*output_directory->_vptr_GeneratorContext[2])(output_directory,&filename);
        pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
        io::Printer::Printer(&printer,pZVar5,'$');
        io::Printer::Print(&printer,"// Generated by the protocol buffer compiler.  DO NOT EDIT!\n")
        ;
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print(&printer,"\npackage $package$;\n","package",&this->java_package_);
        }
        EnumGenerator::EnumGenerator(&local_f8,(EnumDescriptor *)(lVar1 + local_150),pPVar2);
        EnumGenerator::Generate(&local_f8,&printer);
        EnumGenerator::~EnumGenerator(&local_f8);
        io::Printer::~Printer(&printer);
        if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
        }
        std::__cxx11::string::~string((string *)&filename);
        pFVar6 = this->file_;
        local_150 = local_150 + 0x38;
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* output_directory,
                                     vector<string>* file_list) {
  if (params_.java_multiple_files(file_->name())) {
    for (int i = 0; i < file_->message_type_count(); i++) {
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        output_directory, file_list, params_);
    }

    if (params_.java_enum_style()) {
      for (int i = 0; i < file_->enum_type_count(); i++) {
        GenerateSibling<EnumGenerator>(package_dir, java_package_,
                                       file_->enum_type(i),
                                       output_directory, file_list, params_);
      }
    }
  }
}